

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O3

Aig_Man_t * Ssw_SignalCorrespondence(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Ssw_Man_t *p;
  Ssw_Cla_t *pSVar3;
  Ssw_Sml_t *pManData;
  int *piVar4;
  Aig_Man_t *pAigStop;
  Ssw_Pars_t local_c8;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswCore.c"
                  ,0x1a4,"Aig_Man_t *Ssw_SignalCorrespondence(Aig_Man_t *, Ssw_Pars_t *)");
  }
  Aig_ManRandom(1);
  if (pPars == (Ssw_Pars_t *)0x0) {
    pPars = &local_c8;
    memset(pPars,0,0xa8);
    local_c8.nFramesK = 1;
    local_c8.nFramesAddSim = 2;
    local_c8.nBTLimit = 1000;
    local_c8.nBTLimitGlobal = 5000000;
    local_c8.nMinDomSize = 100;
    local_c8.nItersStop = -1;
    local_c8.nResimDelta = 1000;
    local_c8.nStepsMax = -1;
    local_c8.fPolarFlip = 0;
    local_c8.fLatchCorr = 0;
    local_c8.fConstCorr = 0;
    local_c8.fOutputCorr = 0;
    local_c8.fSemiFormal = 0;
    local_c8.fDynamic = 0;
    local_c8.fLocalSim = 0;
    local_c8.fLatchCorrOpt = 0;
    local_c8.nSatVarMax = 1000;
    local_c8.nRecycleCalls = 0x32;
    local_c8.nSatVarMax2 = 5000;
    local_c8.nRecycleCalls2 = 0xfa;
  }
  if (pAig->nObjs[6] + pAig->nObjs[5] == 0) {
    pPars->nIters = 0;
    Aig_ManReprStart(pAig,pAig->vObjs->nSize);
    pAVar2 = Aig_ManDupOrdered(pAig);
    return pAVar2;
  }
  if (pPars->fLatchCorrOpt == 0) {
    if (pPars->nFramesK < 1) {
      __assert_fail("pPars->nFramesK > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswCore.c"
                    ,0x1bc,"Aig_Man_t *Ssw_SignalCorrespondence(Aig_Man_t *, Ssw_Pars_t *)");
    }
    if ((0 < pPars->nPartSize) && (pPars->nPartSize < pAig->nRegs)) goto LAB_006aba52;
  }
  else {
    pPars->fLatchCorr = 1;
    pPars->nFramesAddSim = 0;
  }
  if ((pAig->vClockDoms != (Vec_Vec_t *)0x0) && (0 < pAig->vClockDoms->nSize)) {
LAB_006aba52:
    pAVar2 = Ssw_SignalCorrespondencePart(pAig,pPars);
    return pAVar2;
  }
  if (pPars->fScorrGia != 0) {
    if (pPars->fLatchCorrOpt == 0) {
      pAVar2 = Cec_SignalCorrespondence(pAig,pPars->nBTLimit,pPars->fUseCSat);
      return pAVar2;
    }
    pAVar2 = Cec_LatchCorrespondence(pAig,pPars->nBTLimit,pPars->fUseCSat);
    return pAVar2;
  }
  p = Ssw_ManCreate(pAig,pPars);
  if (p->pPars->fConstrs == 0) {
    pSVar3 = Ssw_ClassesPrepare(pAig,pPars->nFramesK,pPars->fLatchCorr,pPars->fConstCorr,
                                pPars->fOutputCorr,pPars->nMaxLevs,pPars->fVerbose);
    p->ppClasses = pSVar3;
    iVar1 = 2;
    if (pPars->fLatchCorrOpt == 0) {
      if (pPars->fDynamic == 0) {
        iVar1 = 1;
      }
      else {
        iVar1 = p->nFrames;
      }
      iVar1 = iVar1 + p->pPars->nFramesAddSim;
    }
    pManData = Ssw_SmlStart(pAig,0,iVar1,1);
    p->pSml = pManData;
    Ssw_ClassesSetData(p->ppClasses,pManData,Ssw_SmlObjHashWord,Ssw_SmlObjIsConstWord,
                       Ssw_SmlObjsAreEqualWord);
  }
  else {
    pSVar3 = Ssw_ClassesPrepareSimple(pAig,pPars->fLatchCorr,pPars->nMaxLevs);
    p->ppClasses = pSVar3;
    Ssw_ClassesSetData(pSVar3,(void *)0x0,(_func_uint_void_ptr_Aig_Obj_t_ptr *)0x0,
                       Ssw_SmlObjIsConstBit,Ssw_SmlObjsAreEqualBit);
    pAVar2 = pAig;
    iVar1 = Ssw_ManSetConstrPhases(pAig,p->pPars->nFramesK + 1,&p->vInits);
    if (iVar1 != 0) {
      pAigStop = (Aig_Man_t *)0x0;
      Abc_Print((int)pAVar2,
                "Ssw_SignalCorrespondence(): The init state does not satisfy the constraints!\n");
      p->pPars->fVerbose = 0;
      goto LAB_006abbe5;
    }
    Ssw_ManRefineByConstrSim(p);
  }
  if ((p->pPars->fLocalSim != 0) && (p->pSml != (Ssw_Sml_t *)0x0)) {
    iVar1 = Ssw_SmlNumFrames(p->pSml);
    piVar4 = (int *)calloc((long)iVar1 * (long)p->pAig->vObjs->nSize,4);
    p->pVisited = piVar4;
  }
  pAigStop = Ssw_SignalCorrespondenceRefine(p);
  if ((pPars->fConstrs != 0) && (pPars->fVerbose != 0)) {
    Ssw_ReportConeReductions(p,pAig,pAigStop);
  }
LAB_006abbe5:
  Ssw_ManStop(p);
  return pAigStop;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondence( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Ssw_Pars_t Pars;
    Aig_Man_t * pAigNew;
    Ssw_Man_t * p;
    assert( Aig_ManRegNum(pAig) > 0 );
    // reset random numbers
    Aig_ManRandom( 1 );
    // if parameters are not given, create them
    if ( pPars == NULL )
        Ssw_ManSetDefaultParams( pPars = &Pars );
    // consider the case of empty AIG
    if ( Aig_ManNodeNum(pAig) == 0 )
    {
        pPars->nIters = 0;
        // Ntl_ManFinalize() needs the following to satisfy an assertion
        Aig_ManReprStart( pAig,Aig_ManObjNumMax(pAig) );
        return Aig_ManDupOrdered(pAig);
    }
    // check and update parameters
    if ( pPars->fLatchCorrOpt )
    {
        pPars->fLatchCorr = 1;
        pPars->nFramesAddSim = 0;
        if ( (pAig->vClockDoms && Vec_VecSize(pAig->vClockDoms) > 0) )
           return Ssw_SignalCorrespondencePart( pAig, pPars );
    }
    else
    {
        assert( pPars->nFramesK > 0 );
        // perform partitioning
        if ( (pPars->nPartSize > 0 && pPars->nPartSize < Aig_ManRegNum(pAig))
             || (pAig->vClockDoms && Vec_VecSize(pAig->vClockDoms) > 0)  )
            return Ssw_SignalCorrespondencePart( pAig, pPars );
    }

    if ( pPars->fScorrGia )
    {
        if ( pPars->fLatchCorrOpt )
        {
            extern Aig_Man_t * Cec_LatchCorrespondence( Aig_Man_t * pAig, int nConfs, int fUseCSat );
            return Cec_LatchCorrespondence( pAig, pPars->nBTLimit, pPars->fUseCSat );
        }
        else
        {
            extern Aig_Man_t * Cec_SignalCorrespondence( Aig_Man_t * pAig, int nConfs, int fUseCSat );
            return Cec_SignalCorrespondence( pAig, pPars->nBTLimit, pPars->fUseCSat );
        }
    }

    // start the induction manager
    p = Ssw_ManCreate( pAig, pPars );
    // compute candidate equivalence classes
//    p->pPars->nConstrs = 1;
    if ( p->pPars->fConstrs )
    {
        // create trivial equivalence classes with all nodes being candidates for constant 1
        p->ppClasses = Ssw_ClassesPrepareSimple( pAig, pPars->fLatchCorr, pPars->nMaxLevs );
        Ssw_ClassesSetData( p->ppClasses, NULL, NULL, Ssw_SmlObjIsConstBit, Ssw_SmlObjsAreEqualBit );
        // derive phase bits to satisfy the constraints
        if ( Ssw_ManSetConstrPhases( pAig, p->pPars->nFramesK + 1, &p->vInits ) != 0 )
        {
            Abc_Print( 1, "Ssw_SignalCorrespondence(): The init state does not satisfy the constraints!\n" );
            p->pPars->fVerbose = 0;
            Ssw_ManStop( p );
            return NULL;
        }
        // perform simulation of the first timeframes
        Ssw_ManRefineByConstrSim( p );
    }
    else
    {
        // perform one round of seq simulation and generate candidate equivalence classes
        p->ppClasses = Ssw_ClassesPrepare( pAig, pPars->nFramesK, pPars->fLatchCorr, pPars->fConstCorr, pPars->fOutputCorr, pPars->nMaxLevs, pPars->fVerbose );
//        p->ppClasses = Ssw_ClassesPrepareTargets( pAig );
        if ( pPars->fLatchCorrOpt )
            p->pSml = Ssw_SmlStart( pAig, 0, 2, 1 );
        else if ( pPars->fDynamic )
            p->pSml = Ssw_SmlStart( pAig, 0, p->nFrames + p->pPars->nFramesAddSim, 1 );
        else
            p->pSml = Ssw_SmlStart( pAig, 0, 1 + p->pPars->nFramesAddSim, 1 );
        Ssw_ClassesSetData( p->ppClasses, p->pSml, (unsigned(*)(void *,Aig_Obj_t *))Ssw_SmlObjHashWord, (int(*)(void *,Aig_Obj_t *))Ssw_SmlObjIsConstWord, (int(*)(void *,Aig_Obj_t *,Aig_Obj_t *))Ssw_SmlObjsAreEqualWord );
    }
    // allocate storage
    if ( p->pPars->fLocalSim && p->pSml )
        p->pVisited = ABC_CALLOC( int, Ssw_SmlNumFrames( p->pSml ) * Aig_ManObjNumMax(p->pAig) );
    // perform refinement of classes
    pAigNew = Ssw_SignalCorrespondenceRefine( p );
//    Ssw_ReportOutputs( pAigNew );
    if ( pPars->fConstrs && pPars->fVerbose )
        Ssw_ReportConeReductions( p, pAig, pAigNew );
    // cleanup
    Ssw_ManStop( p );
    return pAigNew;
}